

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  StringOutputStream local_30;
  
  psVar1 = this->target_;
  if (psVar1 != (string *)0x0) {
    uVar2 = psVar1->_M_string_length;
    uVar3 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(psVar1->_M_dataplus)._M_p != &psVar1->field_2) {
      uVar3 = (psVar1->field_2)._M_allocated_capacity;
    }
    uVar4 = uVar2 * 2;
    if (uVar2 < uVar3) {
      uVar4 = uVar3;
    }
    if (uVar2 + 0x7fffffff < uVar4) {
      uVar4 = uVar2 + 0x7fffffff;
    }
    uVar3 = 0x10;
    if (0x10 < uVar4) {
      uVar3 = uVar4;
    }
    std::__cxx11::string::resize((ulong)psVar1,(char)uVar3);
    *data = (this->target_->_M_dataplus)._M_p + uVar2;
    *size = (int)this->target_->_M_string_length - (int)uVar2;
    return true;
  }
  Next(&local_30);
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  ABSL_CHECK(target_ != nullptr);
  size_t old_size = target_->size();

  // Grow the string.
  size_t new_size;
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    new_size = target_->capacity();
  } else {
    // Size has reached capacity, try to double it.
    new_size = old_size * 2;
  }
  // Avoid integer overflow in returned '*size'.
  new_size = std::min(new_size, old_size + std::numeric_limits<int>::max());
  // Increase the size, also make sure that it is at least kMinimumSize.
  absl::strings_internal::STLStringResizeUninitialized(
      target_,
      std::max(new_size,
               kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}